

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontstash.h
# Opt level: O1

void fonsPushState(FONScontext *stash)

{
  FONSstate *pFVar1;
  int iVar2;
  undefined8 uVar3;
  FONSstate *pFVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  int iVar9;
  long lVar10;
  
  iVar2 = stash->nstates;
  lVar10 = (long)iVar2;
  if (lVar10 < 0x14) {
    if (0 < iVar2) {
      pFVar1 = stash->states + (iVar2 - 1U);
      iVar6 = pFVar1->font;
      iVar7 = pFVar1->align;
      fVar8 = pFVar1->size;
      iVar9 = pFVar1->blurType;
      pFVar1 = stash->states + (iVar2 - 1U);
      fVar5 = pFVar1->blur;
      uVar3 = *(undefined8 *)(&pFVar1->color + 2);
      pFVar4 = stash->states + lVar10;
      pFVar4->color = pFVar1->color;
      pFVar4->blur = fVar5;
      *(undefined8 *)(&pFVar4->color + 2) = uVar3;
      pFVar1 = stash->states + lVar10;
      pFVar1->font = iVar6;
      pFVar1->align = iVar7;
      pFVar1->size = fVar8;
      pFVar1->blurType = iVar9;
    }
    stash->nstates = stash->nstates + 1;
  }
  else if (stash->handleError != (_func_void_void_ptr_int_int *)0x0) {
    (*stash->handleError)(stash->errorUptr,3,0);
    return;
  }
  return;
}

Assistant:

void fonsPushState(FONScontext* stash) {
    if (stash->nstates >= FONS_MAX_STATES) {
        if (stash->handleError)
            stash->handleError(stash->errorUptr, FONS_STATES_OVERFLOW, 0);
        return;
    }
    if (stash->nstates > 0)
        memcpy(&stash->states[stash->nstates], &stash->states[stash->nstates-1], sizeof(FONSstate));
    stash->nstates++;
}